

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_footer_abi_cxx11_(Formatter *this,App *app)

{
  bool bVar1;
  App *in_RDX;
  string *in_RDI;
  string footer;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  
  __lhs = in_RDI;
  App::get_footer_abi_cxx11_(in_RDX);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18f95f);
  if (bVar1) {
    ::std::__cxx11::string::string(in_stack_ffffffffffffff90);
  }
  else {
    ::std::operator+(in_stack_ffffffffffffffc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ::std::operator+(__lhs,(char *)in_RDI);
    ::std::__cxx11::string::~string(in_RDI);
  }
  ::std::__cxx11::string::~string(in_RDI);
  return __lhs;
}

Assistant:

CLI11_INLINE std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(footer.empty()) {
        return std::string{};
    }
    return "\n" + footer + "\n";
}